

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

bool __thiscall
duckdb::ART::SearchCloseRange
          (ART *this,ARTKey *lower_bound,ARTKey *upper_bound,bool left_equal,bool right_equal,
          idx_t max_count,unsafe_vector<row_t> *row_ids)

{
  bool bVar1;
  bool bVar2;
  Iterator it;
  Iterator local_b8;
  
  Iterator::Iterator(&local_b8,this);
  bVar1 = Iterator::LowerBound(&local_b8,&this->tree,lower_bound,left_equal,0);
  bVar2 = true;
  if (bVar1) {
    bVar2 = Iterator::Scan(&local_b8,upper_bound,max_count,row_ids,right_equal);
  }
  ::std::_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>::~_Deque_base
            ((_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_> *)
             &local_b8.nodes);
  if (local_b8.current_key.key_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.current_key.key_bytes.
                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool ART::SearchCloseRange(ARTKey &lower_bound, ARTKey &upper_bound, bool left_equal, bool right_equal, idx_t max_count,
                           unsafe_vector<row_t> &row_ids) {
	// Find the first node that satisfies the left predicate.
	Iterator it(*this);

	// Early-out, if the maximum value in the ART is lower than the lower bound.
	if (!it.LowerBound(tree, lower_bound, left_equal, 0)) {
		return true;
	}

	// Continue the scan until we reach the upper bound.
	return it.Scan(upper_bound, max_count, row_ids, right_equal);
}